

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O1

int CMU462::Collada::ColladaParser::load(char *filename,SceneInfo *sceneInfo)

{
  char cVar1;
  int iVar2;
  XMLElement *pXVar3;
  XMLElement *pXVar4;
  char *pcVar5;
  size_t sVar6;
  double *pdVar7;
  long lVar8;
  allocator *paVar9;
  undefined8 *puVar10;
  byte bVar11;
  string up_dir;
  XMLDocument doc;
  ifstream in;
  undefined1 *local_5c8 [2];
  undefined1 local_5b8 [16];
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  allocator local_528 [128];
  XMLDocument local_4a8;
  undefined1 local_228 [520];
  
  bVar11 = 0;
  std::ifstream::ifstream(local_228,filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning: could not open file ",0x1d);
    if (filename == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x329c08);
    }
    else {
      sVar6 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    std::ostream::put('\b');
    iVar2 = -1;
    std::ostream::flush();
LAB_001671ad:
    std::ifstream::~ifstream(local_228);
    return iVar2;
  }
  std::ifstream::close();
  tinyxml2::XMLDocument::XMLDocument(&local_4a8,true,PRESERVE_WHITESPACE);
  tinyxml2::XMLDocument::LoadFile(&local_4a8,filename);
  if (local_4a8._errorID == XML_NO_ERROR) {
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&local_4a8.super_XMLNode,"COLLADA");
    if (pXVar3 != (XMLElement *)0x0) {
      scene = sceneInfo;
      uri_load(pXVar3);
      local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"asset","");
      pXVar4 = get_element(pXVar3,&local_548);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p);
      }
      if (pXVar4 != (XMLElement *)0x0) {
        local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"up_axis","");
        pXVar4 = get_element(pXVar4,&local_568);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p);
        }
        if (pXVar4 == (XMLElement *)0x0) goto LAB_001671d7;
        pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)local_5c8,pcVar5,local_528);
        Matrix4x4::identity();
        paVar9 = local_528;
        puVar10 = &transform;
        for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
          *puVar10 = *(undefined8 *)paVar9;
          paVar9 = paVar9 + ((ulong)bVar11 * -2 + 1) * 8;
          puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
        }
        iVar2 = std::__cxx11::string::compare((char *)local_5c8);
        if (iVar2 == 0) {
          pdVar7 = Matrix4x4::operator()((Matrix4x4 *)&transform,0,0);
          *pdVar7 = 0.0;
          pdVar7 = Matrix4x4::operator()((Matrix4x4 *)&transform,0,1);
          *pdVar7 = 1.0;
          pdVar7 = Matrix4x4::operator()((Matrix4x4 *)&transform,1,0);
          *pdVar7 = 1.0;
          pdVar7 = Matrix4x4::operator()((Matrix4x4 *)&transform,1,1);
          *pdVar7 = 0.0;
          pdVar7 = Matrix4x4::operator()((Matrix4x4 *)&transform,2,2);
          *pdVar7 = -1.0;
          up._0_8_ = 0x3ff0000000000000;
          up._8_8_ = 0;
          up._16_8_ = 0;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)local_5c8);
          if (iVar2 == 0) {
            pdVar7 = Matrix4x4::operator()((Matrix4x4 *)&transform,1,1);
            *pdVar7 = 0.0;
            pdVar7 = Matrix4x4::operator()((Matrix4x4 *)&transform,1,2);
            *pdVar7 = 1.0;
            pdVar7 = Matrix4x4::operator()((Matrix4x4 *)&transform,2,1);
            *pdVar7 = 1.0;
            pdVar7 = Matrix4x4::operator()((Matrix4x4 *)&transform,2,2);
            *pdVar7 = 0.0;
            pdVar7 = Matrix4x4::operator()((Matrix4x4 *)&transform,0,0);
            *pdVar7 = -1.0;
            up._0_8_ = 0;
            up._8_8_ = 0;
            up._16_8_ = 0x3ff0000000000000;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)local_5c8);
            if (iVar2 != 0) goto LAB_001671d7;
            up._0_8_ = 0;
            up._8_8_ = 0x3ff0000000000000;
            up._16_8_ = 0;
          }
        }
        if (local_5c8[0] != local_5b8) {
          operator_delete(local_5c8[0]);
        }
      }
      local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_588,"scene/instance_visual_scene","");
      pXVar3 = get_element(pXVar3,&local_588);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_dataplus._M_p != &local_588.field_2) {
        operator_delete(local_588._M_dataplus._M_p);
      }
      if (pXVar3 != (XMLElement *)0x0) {
        local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"node","");
        pXVar4 = get_element(pXVar3,&local_5a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p);
        }
        for (; pXVar4 != (XMLElement *)0x0;
            pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"node")) {
          parse_node(pXVar4);
        }
      }
      iVar2 = -(uint)(pXVar3 == (XMLElement *)0x0);
      tinyxml2::XMLDocument::~XMLDocument(&local_4a8);
      goto LAB_001671ad;
    }
  }
  else {
    tinyxml2::XMLDocument::PrintError(&local_4a8);
  }
LAB_001671d7:
  exit(1);
}

Assistant:

int ColladaParser::load(const char* filename, SceneInfo* sceneInfo) {
  ifstream in(filename);
  if (!in.is_open()) {
    cerr << "Warning: could not open file " << filename << endl;
    return -1;
  }
  in.close();

  XMLDocument doc;
  doc.LoadFile(filename);
  if (doc.Error()) {
    stat("XML error: ");
    doc.PrintError();
    exit(EXIT_FAILURE);
  }

  // Check XML schema
  XMLElement* root = doc.FirstChildElement("COLLADA");
  if (!root) {
    stat("Error: not a COLLADA file!") exit(EXIT_FAILURE);
  } else {
    stat("Loading COLLADA file...");
  }

  // Set output scene pointer
  scene = sceneInfo;

  // Build uri table
  uri_load(root);

  // Load assets - correct up direction
  if (XMLElement* e_asset = get_element(root, "asset")) {
    XMLElement* up_axis = get_element(e_asset, "up_axis");
    if (!up_axis) {
      stat("Error: No up direction defined in COLLADA file");
      exit(EXIT_FAILURE);
    }

    // get up direction and correct non-Y_UP scenes by setting a non-identity
    // global entry transformation, assuming right hand coordinate system for
    // both input and output

    string up_dir = up_axis->GetText();
    transform = Matrix4x4::identity();
    if (up_dir == "X_UP") {
      // swap X-Y and negate Z
      transform(0, 0) = 0;
      transform(0, 1) = 1;
      transform(1, 0) = 1;
      transform(1, 1) = 0;
      transform(2, 2) = -1;

      // local up direction for lights and cameras
      up = Vector3D(1, 0, 0);

    } else if (up_dir == "Z_UP") {
      // swap Z-Y matrix and negate X
      transform(1, 1) = 0;
      transform(1, 2) = 1;
      transform(2, 1) = 1;
      transform(2, 2) = 0;
      transform(0, 0) = -1;

      // local up direction cameras
      up = Vector3D(0, 0, 1);

    } else if (up_dir == "Y_UP") {
      up = Vector3D(0, 1, 0);  // no need to correct Y_UP as its used internally
    } else {
      stat("Error: invalid up direction in COLLADA file");
      exit(EXIT_FAILURE);
    }
  }

  // Load scene -
  // A scene should only have one visual_scene instance, this constraint
  // creates a one-to-one relationship between the document, the top-level
  // scene, and its visual description (COLLADA spec 1.4 page 91)
  if (XMLElement* e_scene = get_element(root, "scene/instance_visual_scene")) {
    stat("Loading scene...");

    // parse all nodes in scene
    XMLElement* e_node = get_element(e_scene, "node");
    while (e_node) {
      parse_node(e_node);
      e_node = e_node->NextSiblingElement("node");
    }

  } else {
    stat("Error: No scene description found in file:" << filename);
    return -1;
  }

  return 0;
}